

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Obj_t * Abc_NtkFromMappedGia_rec(Abc_Ntk_t *pNtkNew,Gia_Man_t *p,int iObj,int fAddInv)

{
  Gia_Obj_t *pGVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pSop;
  ulong uVar4;
  
  pGVar1 = Gia_ManObj(p,iObj);
  if ((int)pGVar1->Value < 0) {
    Abc_NtkFromMappedGia_rec(pNtkNew,p,iObj - (*(uint *)pGVar1 & 0x1fffffff),0);
    Abc_NtkFromMappedGia_rec(pNtkNew,p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),0);
    pAVar2 = Abc_NtkCreateNode(pNtkNew);
    pAVar3 = Abc_NtkObj(pNtkNew,pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value);
    Abc_ObjAddFanin(pAVar2,pAVar3);
    pAVar3 = Abc_NtkObj(pNtkNew,pGVar1[-((ulong)*(uint *)&pGVar1->field_0x4 & 0x1fffffff)].Value);
    Abc_ObjAddFanin(pAVar2,pAVar3);
    pSop = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,2,(int *)0x0);
    (pAVar2->field_5).pData = pSop;
    uVar4 = *(ulong *)pGVar1;
    if (((uint)uVar4 >> 0x1d & 1) != 0) {
      Abc_SopComplementVar(pSop,0);
      uVar4 = *(ulong *)pGVar1;
    }
    if ((uVar4 >> 0x3d & 1) != 0) {
      Abc_SopComplementVar((char *)(pAVar2->field_5).pData,1);
    }
    pGVar1->Value = pAVar2->Id;
  }
  else {
    pAVar2 = Abc_NtkObj(pNtkNew,pGVar1->Value);
  }
  if (fAddInv != 0) {
    pAVar2 = Abc_NtkCreateNodeInv(pNtkNew,pAVar2);
    return pAVar2;
  }
  return pAVar2;
}

Assistant:

Abc_Obj_t * Abc_NtkFromMappedGia_rec( Abc_Ntk_t * pNtkNew, Gia_Man_t * p, int iObj, int fAddInv )
{
    Abc_Obj_t * pObjNew;
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( Gia_ObjValue(pObj) >= 0 )
        pObjNew = Abc_NtkObj( pNtkNew, Gia_ObjValue(pObj) );
    else
    {
        Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId0(pObj, iObj), 0 );
        Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId1(pObj, iObj), 0 );
        pObjNew = Abc_NtkCreateNode( pNtkNew );
        Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
        Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
        pObjNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, 2, NULL );
        if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
        if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
        pObj->Value = Abc_ObjId( pObjNew );
    }
    if ( fAddInv )
        pObjNew = Abc_NtkCreateNodeInv(pNtkNew, pObjNew);
    return pObjNew;
}